

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int array_container_shrink_to_fit(array_container_t *src)

{
  uint16_t *__ptr;
  uint16_t *puVar1;
  uint16_t *oldarray;
  int savings;
  array_container_t *src_local;
  
  if (src->cardinality == src->capacity) {
    src_local._4_4_ = 0;
  }
  else {
    src_local._4_4_ = src->capacity - src->cardinality;
    src->capacity = src->cardinality;
    if (src->capacity == 0) {
      free(src->array);
      src->array = (uint16_t *)0x0;
    }
    else {
      __ptr = src->array;
      puVar1 = (uint16_t *)realloc(__ptr,(long)src->capacity << 1);
      src->array = puVar1;
      if (src->array == (uint16_t *)0x0) {
        free(__ptr);
      }
    }
  }
  return src_local._4_4_;
}

Assistant:

int array_container_shrink_to_fit(array_container_t *src) {
    if (src->cardinality == src->capacity) return 0;  // nothing to do
    int savings = src->capacity - src->cardinality;
    src->capacity = src->cardinality;
    if( src->capacity == 0) { // we do not want to rely on realloc for zero allocs
      free(src->array);
      src->array = NULL;
    } else {
      uint16_t *oldarray = src->array;
      src->array =
        (uint16_t *)realloc(oldarray, src->capacity * sizeof(uint16_t));
      if (src->array == NULL) free(oldarray);  // should never happen?
    }
    return savings;
}